

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

void sg_init_pass(sg_pass pass_id,sg_pass_desc *desc)

{
  sg_image sVar1;
  _sg_pass_t *pass;
  long lVar2;
  sg_pass_desc *psVar3;
  sg_pass_desc desc_def;
  sg_pass_desc local_60;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e36,"void sg_init_pass(sg_pass, const sg_pass_desc *)");
  }
  psVar3 = &local_60;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    sVar1.id = desc->color_attachments[0].image.id;
    psVar3->_start_canary = desc->_start_canary;
    psVar3->color_attachments[0].image = (sg_image)sVar1.id;
    desc = (sg_pass_desc *)&desc->color_attachments[0].mip_level;
    psVar3 = (sg_pass_desc *)&psVar3->color_attachments[0].mip_level;
  }
  if (pass_id.id != 0) {
    pass = _sg_pass_at(&_sg.pools,pass_id.id);
    if ((pass->slot).id == pass_id.id) goto LAB_00111ad3;
  }
  pass = (_sg_pass_t *)0x0;
LAB_00111ad3:
  if (pass != (_sg_pass_t *)0x0) {
    if ((pass->slot).state != SG_RESOURCESTATE_ALLOC) {
      if (_sg.desc.logger.log_cb != (_func_void_char_ptr_void_ptr *)0x0) {
        (*_sg.desc.logger.log_cb)
                  ("sg_init_pass: pass must be in alloc state\n",_sg.desc.logger.user_data);
        return;
      }
      puts("sg_init_pass: pass must be in alloc state\n");
      return;
    }
    _sg_init_pass(pass,&local_60);
    if (((pass->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(pass->slot.state == SG_RESOURCESTATE_VALID) || (pass->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                    ,0x3e3c,"void sg_init_pass(sg_pass, const sg_pass_desc *)");
    }
  }
  return;
}

Assistant:

inline void sg_init_pass(sg_pass pass_id, const sg_pass_desc& desc) { return sg_init_pass(pass_id, &desc); }